

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_match.c
# Opt level: O0

wchar_t set_timefilter_date_w(archive_match *a,wchar_t timetype,wchar_t *datestr)

{
  wchar_t wVar1;
  size_t len;
  int *piVar2;
  time_t mtime_sec;
  time_t t;
  archive_string as;
  wchar_t *datestr_local;
  wchar_t timetype_local;
  archive_match *a_local;
  
  as.buffer_length = (size_t)datestr;
  if ((datestr == (wchar_t *)0x0) || (*datestr == L'\0')) {
    archive_set_error(&a->archive,0x16,"date is empty");
    a_local._4_4_ = L'\xffffffe7';
  }
  else {
    t = 0;
    as.s = (char *)0x0;
    as.length = 0;
    len = wcslen(datestr);
    wVar1 = archive_string_append_from_wcs((archive_string *)&t,datestr,len);
    if (wVar1 < L'\0') {
      archive_string_free((archive_string *)&t);
      piVar2 = __errno_location();
      if (*piVar2 == 0xc) {
        a_local._4_4_ = error_nomem(a);
      }
      else {
        archive_set_error(&a->archive,-1,"Failed to convert WCS to MBS");
        a_local._4_4_ = L'\xffffffe7';
      }
    }
    else {
      mtime_sec = __archive_get_date(a->now,(char *)t);
      archive_string_free((archive_string *)&t);
      if (mtime_sec == -1) {
        archive_set_error(&a->archive,0x16,"invalid date string");
        a_local._4_4_ = L'\xffffffe7';
      }
      else {
        a_local._4_4_ = set_timefilter(a,timetype,mtime_sec,0,mtime_sec,0);
      }
    }
  }
  return a_local._4_4_;
}

Assistant:

static int
set_timefilter_date_w(struct archive_match *a, int timetype,
    const wchar_t *datestr)
{
	struct archive_string as;
	time_t t;

	if (datestr == NULL || *datestr == L'\0') {
		archive_set_error(&(a->archive), EINVAL, "date is empty");
		return (ARCHIVE_FAILED);
	}

	archive_string_init(&as);
	if (archive_string_append_from_wcs(&as, datestr, wcslen(datestr)) < 0) {
		archive_string_free(&as);
		if (errno == ENOMEM)
			return (error_nomem(a));
		archive_set_error(&(a->archive), -1,
		    "Failed to convert WCS to MBS");
		return (ARCHIVE_FAILED);
	}
	t = get_date(a->now, as.s);
	archive_string_free(&as);
	if (t == (time_t)-1) {
		archive_set_error(&(a->archive), EINVAL, "invalid date string");
		return (ARCHIVE_FAILED);
	}
	return set_timefilter(a, timetype, t, 0, t, 0);
}